

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::BuildFileCollectingErrors
          (DescriptorPool *this,FileDescriptorProto *proto,ErrorCollector *error_collector)

{
  LogMessage *pLVar1;
  FileDescriptor *pFVar2;
  LogMessage LStack_158;
  LogMessage local_120;
  DescriptorBuilder local_e8;
  
  if (this->fallback_database_ != (DescriptorDatabase *)0x0) {
    internal::LogMessage::LogMessage
              (&local_120,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
               ,0x9d0);
    pLVar1 = internal::LogMessage::operator<<
                       (&local_120,"CHECK failed: fallback_database_ == NULL: ");
    pLVar1 = internal::LogMessage::operator<<
                       (pLVar1,
                        "Cannot call BuildFile on a DescriptorPool that uses a DescriptorDatabase.  You must instead find a way to get your file into the underlying database."
                       );
    internal::LogFinisher::operator=((LogFinisher *)&local_e8,pLVar1);
    internal::LogMessage::~LogMessage(&local_120);
  }
  if (this->mutex_ != (Mutex *)0x0) {
    internal::LogMessage::LogMessage
              (&LStack_158,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
               ,0x9d4);
    pLVar1 = internal::LogMessage::operator<<(&LStack_158,"CHECK failed: mutex_ == NULL: ");
    internal::LogFinisher::operator=((LogFinisher *)&local_e8,pLVar1);
    internal::LogMessage::~LogMessage(&LStack_158);
  }
  local_e8.tables_ = (this->tables_).ptr_;
  local_e8.filename_._M_dataplus._M_p = (pointer)&local_e8.filename_.field_2;
  local_e8.options_to_interpret_.
  super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.options_to_interpret_.
  super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_e8.options_to_interpret_.
  super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_e8.options_to_interpret_.
  super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_e8._41_8_ = 0;
  local_e8.filename_._M_string_length = 0;
  local_e8.filename_.field_2._M_local_buf[0] = '\0';
  local_e8.dependencies_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_e8.dependencies_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_e8.dependencies_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_e8.dependencies_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e8.possible_undeclared_dependency_name_._M_dataplus._M_p =
       (pointer)&local_e8.possible_undeclared_dependency_name_.field_2;
  local_e8.dependencies_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e8.possible_undeclared_dependency_ = (FileDescriptor *)0x0;
  local_e8.possible_undeclared_dependency_name_._M_string_length = 0;
  local_e8.possible_undeclared_dependency_name_.field_2._M_local_buf[0] = '\0';
  local_e8.pool_ = this;
  local_e8.error_collector_ = error_collector;
  local_e8.dependencies_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_e8.dependencies_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pFVar2 = DescriptorBuilder::BuildFile(&local_e8,proto);
  DescriptorBuilder::~DescriptorBuilder(&local_e8);
  return pFVar2;
}

Assistant:

const FileDescriptor* DescriptorPool::BuildFileCollectingErrors(
    const FileDescriptorProto& proto,
    ErrorCollector* error_collector) {
  GOOGLE_CHECK(fallback_database_ == NULL)
    << "Cannot call BuildFile on a DescriptorPool that uses a "
       "DescriptorDatabase.  You must instead find a way to get your file "
       "into the underlying database.";
  GOOGLE_CHECK(mutex_ == NULL);   // Implied by the above GOOGLE_CHECK.
  return DescriptorBuilder(this, tables_.get(),
                           error_collector).BuildFile(proto);
}